

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

MaybeResult<wasm::Ok> *
wasm::WATParser::instr<wasm::WATParser::ParseModuleTypesCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseModuleTypesCtx *ctx)

{
  undefined8 uVar1;
  bool bVar2;
  __optional_eq_t<std::basic_string_view<char>,_std::basic_string_view<char>_> _Var3;
  __optional_eq_t<std::basic_string_view<char>,_std::basic_string_view<char>_> local_101;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_> local_f0;
  byte local_d1;
  uint local_d0;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_> local_c0;
  byte local_a1;
  basic_string_view<char,_std::char_traits<char>_> local_a0;
  basic_string_view<char,_std::char_traits<char>_> local_90;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  undefined1 local_30 [8];
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> keyword;
  ParseModuleTypesCtx *ctx_local;
  MaybeResult<wasm::Ok> *inst;
  
  keyword.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _16_8_ = ctx;
  Lexer::peekKeyword((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)local_30,
                     &ctx->in);
  bVar2 = std::optional::operator_cast_to_bool((optional *)local_30);
  if (bVar2) {
    local_40 = sv("end",3);
    _Var3 = std::operator==((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                            local_30,&local_40);
    local_101 = true;
    if (!_Var3) {
      local_50 = sv("then",4);
      _Var3 = std::operator==((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                              local_30,&local_50);
      local_101 = true;
      if (!_Var3) {
        local_60 = sv("else",4);
        _Var3 = std::operator==((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                                local_30,&local_60);
        local_101 = true;
        if (!_Var3) {
          local_70 = sv("catch",5);
          _Var3 = std::operator==((optional<std::basic_string_view<char,_std::char_traits<char>_>_>
                                   *)local_30,&local_70);
          local_101 = true;
          if (!_Var3) {
            local_80 = sv("catch_all",9);
            _Var3 = std::operator==((optional<std::basic_string_view<char,_std::char_traits<char>_>_>
                                     *)local_30,&local_80);
            local_101 = true;
            if (!_Var3) {
              local_90 = sv("delegate",8);
              _Var3 = std::operator==((optional<std::basic_string_view<char,_std::char_traits<char>_>_>
                                       *)local_30,&local_90);
              local_101 = true;
              if (!_Var3) {
                local_a0 = sv("ref",3);
                local_101 = std::operator==((optional<std::basic_string_view<char,_std::char_traits<char>_>_>
                                             *)local_30,&local_a0);
              }
            }
          }
        }
      }
    }
    if (local_101 != false) {
      MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
  }
  uVar1 = keyword.
          super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
          _M_payload.
          super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
          _16_8_;
  local_a1 = 0;
  Lexer::getAnnotations
            (&local_c0,
             (Lexer *)(keyword.
                       super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                       ._M_payload.
                       super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                       ._16_8_ + 8));
  blockinstr<wasm::WATParser::ParseModuleTypesCtx>
            (__return_storage_ptr__,(ParseModuleTypesCtx *)uVar1,&local_c0);
  std::vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>::~vector
            (&local_c0);
  bVar2 = wasm::MaybeResult::operator_cast_to_bool((MaybeResult *)__return_storage_ptr__);
  if (bVar2) {
    local_a1 = 1;
  }
  local_d0 = (uint)bVar2;
  if ((local_a1 & 1) == 0) {
    MaybeResult<wasm::Ok>::~MaybeResult(__return_storage_ptr__);
  }
  uVar1 = keyword.
          super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
          _M_payload.
          super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
          _16_8_;
  if (local_d0 == 0) {
    local_d1 = 0;
    Lexer::getAnnotations
              (&local_f0,
               (Lexer *)(keyword.
                         super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                         ._M_payload.
                         super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                         ._16_8_ + 8));
    plaininstr<wasm::WATParser::ParseModuleTypesCtx>
              (__return_storage_ptr__,(ParseModuleTypesCtx *)uVar1,&local_f0);
    std::vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>::~vector
              (&local_f0);
    bVar2 = wasm::MaybeResult::operator_cast_to_bool((MaybeResult *)__return_storage_ptr__);
    if (bVar2) {
      local_d1 = 1;
    }
    local_d0 = (uint)bVar2;
    if ((local_d1 & 1) == 0) {
      MaybeResult<wasm::Ok>::~MaybeResult(__return_storage_ptr__);
    }
    if (local_d0 == 0) {
      MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<> instr(Ctx& ctx) {
  // Check for valid strings that are not instructions.
  if (auto keyword = ctx.in.peekKeyword()) {
    if (keyword == "end"sv || keyword == "then"sv || keyword == "else"sv ||
        keyword == "catch"sv || keyword == "catch_all"sv ||
        keyword == "delegate"sv || keyword == "ref"sv) {
      return {};
    }
  }
  if (auto inst = blockinstr(ctx, ctx.in.getAnnotations())) {
    return inst;
  }
  if (auto inst = plaininstr(ctx, ctx.in.getAnnotations())) {
    return inst;
  }
  // TODO: Handle folded plain instructions as well.
  return {};
}